

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptorProto::InternalSwap
          (MethodDescriptorProto *this,MethodDescriptorProto *other)

{
  bool bVar1;
  uint32 uVar2;
  void *pvVar3;
  string *psVar4;
  MethodOptions *pMVar5;
  UnknownFieldSet *other_00;
  
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_002efc1f;
LAB_002efc12:
    other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_002efc12;
    other_00 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
LAB_002efc1f:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  psVar4 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar4;
  psVar4 = (this->input_type_).ptr_;
  (this->input_type_).ptr_ = (other->input_type_).ptr_;
  (other->input_type_).ptr_ = psVar4;
  psVar4 = (this->output_type_).ptr_;
  (this->output_type_).ptr_ = (other->output_type_).ptr_;
  (other->output_type_).ptr_ = psVar4;
  pMVar5 = this->options_;
  this->options_ = other->options_;
  other->options_ = pMVar5;
  bVar1 = this->client_streaming_;
  this->client_streaming_ = other->client_streaming_;
  other->client_streaming_ = bVar1;
  bVar1 = this->server_streaming_;
  this->server_streaming_ = other->server_streaming_;
  other->server_streaming_ = bVar1;
  return;
}

Assistant:

void MethodDescriptorProto::InternalSwap(MethodDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  input_type_.Swap(&other->input_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  output_type_.Swap(&other->output_type_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(options_, other->options_);
  swap(client_streaming_, other->client_streaming_);
  swap(server_streaming_, other->server_streaming_);
}